

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KokkosProfilingSymbols.cpp
# Opt level: O1

void kokkosp_begin_parallel_reduce(char *name,uint32_t devID,uint64_t *kID)

{
  pointer pfVar1;
  function<void_(const_char_*,_unsigned_int,_unsigned_long_*)> *f;
  pointer this;
  
  pfVar1 = kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback.mCb.
           super__Vector_base<std::function<void_(const_char_*,_unsigned_int,_unsigned_long_*)>,_std::allocator<std::function<void_(const_char_*,_unsigned_int,_unsigned_long_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this = kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback.mCb.
         super__Vector_base<std::function<void_(const_char_*,_unsigned_int,_unsigned_long_*)>,_std::allocator<std::function<void_(const_char_*,_unsigned_int,_unsigned_long_*)>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback.mCb.
      super__Vector_base<std::function<void_(const_char_*,_unsigned_int,_unsigned_long_*)>,_std::allocator<std::function<void_(const_char_*,_unsigned_int,_unsigned_long_*)>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback.mCb.
      super__Vector_base<std::function<void_(const_char_*,_unsigned_int,_unsigned_long_*)>,_std::allocator<std::function<void_(const_char_*,_unsigned_int,_unsigned_long_*)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::function<void_(const_char_*,_unsigned_int,_unsigned_long_*)>::operator()
                (this,name,devID,kID);
      this = this + 1;
    } while (this != pfVar1);
  }
  return;
}

Assistant:

void kokkosp_begin_parallel_reduce(const char* name, const uint32_t devID, uint64_t* kID)
{
    kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback(name, devID, kID);
}